

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_open_client__jack(ma_context *pContext,ma_jack_client_t **ppClient)

{
  int iVar1;
  ma_jack_client_t *pmVar2;
  char *local_158;
  size_t local_148;
  ma_jack_client_t *pClient;
  char local_128 [4];
  ma_jack_status_t status;
  char clientName [256];
  size_t maxClientNameSize;
  ma_jack_client_t **ppClient_local;
  ma_context *pContext_local;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x5099,
                  "ma_result ma_context_open_client__jack(ma_context *, ma_jack_client_t **)");
  }
  if (ppClient != (ma_jack_client_t **)0x0) {
    if (ppClient != (ma_jack_client_t **)0x0) {
      *ppClient = (ma_jack_client_t *)0x0;
    }
    iVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)();
    clientName._248_8_ = SEXT48(iVar1);
    local_148 = clientName._248_8_;
    if (0x100 < (ulong)clientName._248_8_) {
      local_148 = 0x100;
    }
    if ((pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max == (ma_proc)0x0) {
      local_158 = "miniaudio";
    }
    else {
      local_158 = (pContext->field_21).jack.pClientName;
    }
    ma_strncpy_s(local_128,local_148,local_158,0xffffffffffffffff);
    pmVar2 = (ma_jack_client_t *)
             (*(pContext->field_21).alsa.snd_pcm_open)
                       (local_128,(ulong)((pContext->field_21).jack.tryStartServer == 0),
                        (long)&pClient + 4,0);
    if (pmVar2 == (ma_jack_client_t *)0x0) {
      pContext_local._4_4_ = -0x12d;
    }
    else {
      if (ppClient != (ma_jack_client_t **)0x0) {
        *ppClient = pmVar2;
      }
      pContext_local._4_4_ = 0;
    }
    return pContext_local._4_4_;
  }
  __assert_fail("ppClient != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x509a,"ma_result ma_context_open_client__jack(ma_context *, ma_jack_client_t **)")
  ;
}

Assistant:

static ma_result ma_context_open_client__jack(ma_context* pContext, ma_jack_client_t** ppClient)
{
    size_t maxClientNameSize;
    char clientName[256];
    ma_jack_status_t status;
    ma_jack_client_t* pClient;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(ppClient != NULL);

    if (ppClient) {
        *ppClient = NULL;
    }

    maxClientNameSize = ((ma_jack_client_name_size_proc)pContext->jack.jack_client_name_size)(); /* Includes null terminator. */
    ma_strncpy_s(clientName, ma_min(sizeof(clientName), maxClientNameSize), (pContext->jack.pClientName != NULL) ? pContext->jack.pClientName : "miniaudio", (size_t)-1);

    pClient = ((ma_jack_client_open_proc)pContext->jack.jack_client_open)(clientName, (pContext->jack.tryStartServer) ? 0 : ma_JackNoStartServer, &status, NULL);
    if (pClient == NULL) {
        return MA_FAILED_TO_OPEN_BACKEND_DEVICE;
    }

    if (ppClient) {
        *ppClient = pClient;
    }

    return MA_SUCCESS;
}